

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.c
# Opt level: O2

el_action_t ed_next_history(EditLine *el,wint_t c)

{
  el_action_t eVar1;
  wchar_t wVar2;
  wchar_t wVar3;
  
  (el->el_chared).c_undo.len = -1;
  *(el->el_line).lastchar = L'\0';
  wVar2 = (el->el_history).eventno - (el->el_state).argument;
  wVar3 = L'\0';
  if (L'\0' < wVar2) {
    wVar3 = wVar2;
  }
  (el->el_history).eventno = wVar3;
  eVar1 = hist_get(el);
  if (eVar1 == '\x04') {
    eVar1 = (wVar2 < L'\0') * '\x05' + '\x04';
  }
  return eVar1;
}

Assistant:

libedit_private el_action_t
/*ARGSUSED*/
ed_next_history(EditLine *el, wint_t c __attribute__((__unused__)))
{
	el_action_t beep = CC_REFRESH, rval;

	el->el_chared.c_undo.len = -1;
	*el->el_line.lastchar = '\0';	/* just in case */

	el->el_history.eventno -= el->el_state.argument;

	if (el->el_history.eventno < 0) {
		el->el_history.eventno = 0;
		beep = CC_REFRESH_BEEP;
	}
	rval = hist_get(el);
	if (rval == CC_REFRESH)
		return beep;
	return rval;

}